

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFEmbeddedFileDocumentHelper.cc
# Opt level: O0

map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<QPDFFileSpecObjectHelper>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<QPDFFileSpecObjectHelper>_>_>_>
* __thiscall
QPDFEmbeddedFileDocumentHelper::getEmbeddedFiles_abi_cxx11_
          (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<QPDFFileSpecObjectHelper>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<QPDFFileSpecObjectHelper>_>_>_>
           *__return_storage_ptr__,QPDFEmbeddedFileDocumentHelper *this)

{
  bool bVar1;
  __shared_ptr *this_00;
  __shared_ptr_access<QPDFNameTreeObjectHelper,_(__gnu_cxx::_Lock_policy)2,_false,_false> *this_01;
  mapped_type *this_02;
  QPDFObjectHandle local_e0;
  reference local_d0;
  T *i;
  iterator __end2;
  undefined1 local_70 [8];
  iterator __begin2;
  element_type *__range2;
  QPDFEmbeddedFileDocumentHelper *this_local;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<QPDFFileSpecObjectHelper>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<QPDFFileSpecObjectHelper>_>_>_>
  *result;
  
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<QPDFFileSpecObjectHelper>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<QPDFFileSpecObjectHelper>_>_>_>
  ::map(__return_storage_ptr__);
  this_00 = (__shared_ptr *)
            std::
            __shared_ptr_access<QPDFEmbeddedFileDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<QPDFEmbeddedFileDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&this->m);
  bVar1 = std::__shared_ptr::operator_cast_to_bool(this_00);
  if (bVar1) {
    this_01 = (__shared_ptr_access<QPDFNameTreeObjectHelper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               *)std::
                 __shared_ptr_access<QPDFEmbeddedFileDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<QPDFEmbeddedFileDocumentHelper::Members,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)&this->m);
    __begin2.ivalue.second.super_BaseHandle.obj.
    super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         std::
         __shared_ptr_access<QPDFNameTreeObjectHelper,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
         operator*(this_01);
    QPDFNameTreeObjectHelper::begin
              ((iterator *)local_70,
               (QPDFNameTreeObjectHelper *)
               __begin2.ivalue.second.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    QPDFNameTreeObjectHelper::end
              ((iterator *)&i,
               (QPDFNameTreeObjectHelper *)
               __begin2.ivalue.second.super_BaseHandle.obj.
               super___shared_ptr<QPDFObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi);
    while (bVar1 = QPDFNameTreeObjectHelper::iterator::operator!=
                             ((iterator *)local_70,(iterator *)&i), bVar1) {
      local_d0 = QPDFNameTreeObjectHelper::iterator::operator*[abi_cxx11_((iterator *)local_70);
      std::make_shared<QPDFFileSpecObjectHelper,QPDFObjectHandle_const&>(&local_e0);
      this_02 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<QPDFFileSpecObjectHelper>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<QPDFFileSpecObjectHelper>_>_>_>
                ::operator[](__return_storage_ptr__,&local_d0->first);
      std::shared_ptr<QPDFFileSpecObjectHelper>::operator=
                (this_02,(shared_ptr<QPDFFileSpecObjectHelper> *)&local_e0);
      std::shared_ptr<QPDFFileSpecObjectHelper>::~shared_ptr
                ((shared_ptr<QPDFFileSpecObjectHelper> *)&local_e0);
      QPDFNameTreeObjectHelper::iterator::operator++((iterator *)local_70);
    }
    QPDFNameTreeObjectHelper::iterator::~iterator((iterator *)&i);
    QPDFNameTreeObjectHelper::iterator::~iterator((iterator *)local_70);
  }
  return __return_storage_ptr__;
}

Assistant:

std::map<std::string, std::shared_ptr<QPDFFileSpecObjectHelper>>
QPDFEmbeddedFileDocumentHelper::getEmbeddedFiles()
{
    std::map<std::string, std::shared_ptr<QPDFFileSpecObjectHelper>> result;
    if (m->embedded_files) {
        for (auto const& i: *(m->embedded_files)) {
            result[i.first] = std::make_shared<QPDFFileSpecObjectHelper>(i.second);
        }
    }
    return result;
}